

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall
Clasp::Solver::Dirty::add<Clasp::ClauseHead>
          (Dirty *this,ClauseHead **list,uintp other,Constraint *c)

{
  bool bVar1;
  unsigned_long uVar2;
  unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
  *in_RCX;
  unsigned_long *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<Clasp::Constraint_*,_true,_false>,_bool> pVar3;
  uint n;
  _Node_iterator_base<Clasp::Constraint_*,_false> in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  
  n = (uint)((ulong)in_RDI >> 0x20);
  uVar2 = set_bit<unsigned_long>((unsigned_long)in_stack_ffffffffffffffd0._M_cur,n);
  *in_RSI = uVar2;
  if (in_RCX != *(unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
                  **)(in_RDI + 0x50)) {
    *(unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
      **)(in_RDI + 0x50) = in_RCX;
    pVar3 = std::
            unordered_set<Clasp::Constraint_*,_std::hash<Clasp::Constraint_*>,_std::equal_to<Clasp::Constraint_*>,_std::allocator<Clasp::Constraint_*>_>
            ::insert(in_RCX,(value_type *)
                            CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffd0._M_cur =
         (__node_type *)pVar3.first.super__Node_iterator_base<Clasp::Constraint_*,_false>._M_cur;
  }
  bVar1 = test_bit<unsigned_long>((unsigned_long)in_stack_ffffffffffffffd0._M_cur,n);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool add(T*& list, uintp other, Constraint* c) {
		other |= reinterpret_cast<uintp>(list);
		list = reinterpret_cast<T*>( set_bit(reinterpret_cast<uintp>(list), 0) );
		if (c != last) { cons.insert(last = c); }
		return !test_bit(other, 0);
	}